

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_hexdump_connection(mg_connection *nc,char *path,void *buf,int num_bytes,int ev)

{
  FILE *__stream;
  undefined8 *puVar1;
  time_t tVar2;
  uint dst_len;
  char *pcVar3;
  char src [60];
  char dst [60];
  
  if (*path == '-') {
    if (path[1] == '\0') {
      puVar1 = (undefined8 *)&stdout;
    }
    else {
      if ((path[1] != '-') || (path[2] != '\0')) goto LAB_00109a49;
      puVar1 = (undefined8 *)&stderr;
    }
    __stream = (FILE *)*puVar1;
  }
  else {
LAB_00109a49:
    __stream = fopen64(path,"a");
  }
  if (__stream != (FILE *)0x0) {
    mg_conn_addr_to_str(nc,src,0x3c,3);
    mg_conn_addr_to_str(nc,dst,0x3c,7);
    tVar2 = time((time_t *)0x0);
    if (ev == 1) {
      pcVar3 = "<A";
    }
    else if (ev == 3) {
      pcVar3 = "<-";
    }
    else if (ev == 4) {
      pcVar3 = "->";
    }
    else {
      pcVar3 = "XX";
      if (ev == 2) {
        pcVar3 = "C>";
      }
    }
    fprintf(__stream,"%lu %p %s %s %s %d\n",tVar2,nc,src,pcVar3,dst,(ulong)(uint)num_bytes);
    if (0 < num_bytes) {
      dst_len = num_bytes * 5 + 100;
      pcVar3 = (char *)malloc((ulong)dst_len);
      if (pcVar3 != (char *)0x0) {
        mg_hexdump(buf,num_bytes,pcVar3,dst_len);
        fputs(pcVar3,__stream);
        free(pcVar3);
      }
    }
    if ((__stream != _stdin) && (__stream != _stdout)) {
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void mg_hexdump_connection(struct mg_connection *nc, const char *path,
                           const void *buf, int num_bytes, int ev) {
    FILE *fp = NULL;
    char *hexbuf, src[60], dst[60];
    int buf_size = num_bytes * 5 + 100;

    if (strcmp(path, "-") == 0) {
        fp = stdout;
    } else if (strcmp(path, "--") == 0) {
        fp = stderr;
#ifndef MG_DISABLE_FILESYSTEM
    } else {
        fp = fopen(path, "a");
#endif
    }
    if (fp == NULL) return;

    mg_conn_addr_to_str(nc, src, sizeof(src),
                        MG_SOCK_STRINGIFY_IP | MG_SOCK_STRINGIFY_PORT);
    mg_conn_addr_to_str(nc, dst, sizeof(dst), MG_SOCK_STRINGIFY_IP |
                                              MG_SOCK_STRINGIFY_PORT |
                                              MG_SOCK_STRINGIFY_REMOTE);
    fprintf(
            fp, "%lu %p %s %s %s %d\n", (unsigned long) time(NULL), nc, src,
            ev == MG_EV_RECV ? "<-" : ev == MG_EV_SEND
                                      ? "->"
                                      : ev == MG_EV_ACCEPT
                                        ? "<A"
                                        : ev == MG_EV_CONNECT ? "C>" : "XX",
            dst, num_bytes);
    if (num_bytes > 0 && (hexbuf = (char *) MG_MALLOC(buf_size)) != NULL) {
        mg_hexdump(buf, num_bytes, hexbuf, buf_size);
        fprintf(fp, "%s", hexbuf);
        MG_FREE(hexbuf);
    }
    if (fp != stdin && fp != stdout) fclose(fp);
}